

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int bitset_container_rank(bitset_container_t *container,uint16_t x)

{
  int iVar1;
  uint64_t mask;
  uint64_t lastpos;
  uint64_t lastword;
  int end;
  int i;
  int sum;
  uint16_t x_local;
  bitset_container_t *container_local;
  
  end = 0;
  for (lastword._4_4_ = 0; lastword._4_4_ < (int)(x / 0x40); lastword._4_4_ = lastword._4_4_ + 1) {
    iVar1 = hamming(container->words[lastword._4_4_]);
    end = iVar1 + end;
  }
  iVar1 = hamming(container->words[lastword._4_4_] & (1L << (sbyte)((ulong)x % 0x40)) * 2 - 1U);
  return iVar1 + end;
}

Assistant:

int bitset_container_rank(const bitset_container_t *container, uint16_t x) {
  // credit: aqrit
  int sum = 0;
  int i = 0;
  for (int end = x / 64; i < end; i++){
    sum += hamming(container->words[i]);
  }
  uint64_t lastword = container->words[i];
  uint64_t lastpos = UINT64_C(1) << (x % 64);
  uint64_t mask = lastpos + lastpos - 1; // smear right
  sum += hamming(lastword & mask);
  return sum;
}